

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

double VP8LHistogramEstimateBits(VP8LHistogram *p)

{
  int length;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  length = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
  if (p->palette_code_bits_ < 1) {
    length = 0x118;
  }
  dVar1 = PopulationCost(p->literal_,length,(uint32_t *)0x0,p->is_used_);
  dVar2 = PopulationCost(p->red_,0x100,(uint32_t *)0x0,p->is_used_ + 1);
  dVar3 = PopulationCost(p->blue_,0x100,(uint32_t *)0x0,p->is_used_ + 2);
  dVar4 = PopulationCost(p->alpha_,0x100,(uint32_t *)0x0,p->is_used_ + 3);
  dVar5 = PopulationCost(p->distance_,0x28,(uint32_t *)0x0,p->is_used_ + 4);
  dVar6 = (*VP8LExtraCost)(p->literal_ + 0x100,0x18);
  dVar7 = (*VP8LExtraCost)(p->distance_,0x28);
  return dVar7 + dVar6 + dVar5 + dVar4 + dVar3 + dVar2 + dVar1;
}

Assistant:

double VP8LHistogramEstimateBits(VP8LHistogram* const p) {
  return
      PopulationCost(p->literal_, VP8LHistogramNumCodes(p->palette_code_bits_),
                     NULL, &p->is_used_[0])
      + PopulationCost(p->red_, NUM_LITERAL_CODES, NULL, &p->is_used_[1])
      + PopulationCost(p->blue_, NUM_LITERAL_CODES, NULL, &p->is_used_[2])
      + PopulationCost(p->alpha_, NUM_LITERAL_CODES, NULL, &p->is_used_[3])
      + PopulationCost(p->distance_, NUM_DISTANCE_CODES, NULL, &p->is_used_[4])
      + VP8LExtraCost(p->literal_ + NUM_LITERAL_CODES, NUM_LENGTH_CODES)
      + VP8LExtraCost(p->distance_, NUM_DISTANCE_CODES);
}